

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O2

tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
* __thiscall
polyscope::CameraExtrinsics::getCameraFrame
          (tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
           *__return_storage_ptr__,CameraExtrinsics *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  *p_Var3;
  int i;
  long lVar4;
  long lVar5;
  int j;
  int iVar6;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *paVar7;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *paVar8;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  col_type cVar13;
  col_type cVar14;
  col_type cVar15;
  mat3x3 R;
  mat<3,_3,_float,_(glm::qualifier)0> Result;
  row_type local_98;
  undefined1 local_8c [8];
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aaStack_84 [6];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_3c [32];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1c;
  
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    lVar5 = lVar4 * 0xc;
    for (iVar6 = 0;
        ((paVar7 = &(this->E).value[lVar4].field_1,
         paVar8 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                  (local_8c + lVar5 + 4), iVar6 == 1 ||
         (paVar7 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                   &(this->E).value[lVar4].field_2,
         paVar8 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                  (local_8c + lVar5 + 8), iVar6 == 2)) ||
        (paVar7 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                  ((this->E).value + lVar4),
        paVar8 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)
                 (local_8c + lVar5), iVar6 != 3)); iVar6 = iVar6 + 1) {
      *paVar8 = *paVar7;
    }
  }
  local_3c = vpermps_avx2(_DAT_002c2300,_local_8c);
  local_98.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_98.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_98.field_2.z = -1.0;
  local_1c = local_6c;
  uVar10 = 0;
  cVar13 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)local_3c,&local_98);
  local_58 = cVar13._0_8_;
  uVar11 = 0;
  local_98.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_98.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_98.field_2.z = 0.0;
  uStack_50 = uVar10;
  cVar14 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)local_3c,&local_98);
  local_68 = cVar14._0_8_;
  auVar12 = (undefined1  [56])0x0;
  local_98._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_98.field_2.z = 0.0;
  uStack_60 = uVar11;
  cVar15 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)local_3c,&local_98);
  auVar9._0_8_ = cVar15._0_8_;
  auVar9._8_56_ = auVar12;
  uVar10 = vmovlps_avx(auVar9._0_16_);
  p_Var3 = &(__return_storage_ptr__->
            super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
            ).
            super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar10;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar10 >> 0x20);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       cVar15.field_2;
  auVar1._8_8_ = uStack_60;
  auVar1._0_8_ = local_68;
  uVar10 = vmovlps_avx(auVar1);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar10;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar10 >> 0x20);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).
  super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<1UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       cVar14.field_2;
  auVar2._8_8_ = uStack_50;
  auVar2._0_8_ = local_58;
  uVar10 = vmovlps_avx(auVar2);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar10;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar10 >> 0x20);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ).super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       cVar13.field_2;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<glm::vec3, glm::vec3, glm::vec3> CameraExtrinsics::getCameraFrame() const {

  glm::mat3x3 R;
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R[i][j] = E[i][j];
    }
  }
  glm::mat3x3 Rt = glm::transpose(R);

  glm::vec3 lookDir = Rt * glm::vec3(0.0, 0.0, -1.0);
  glm::vec3 upDir = Rt * glm::vec3(0.0, 1.0, 0.0);
  glm::vec3 rightDir = Rt * glm::vec3(1.0, 0.0, 0.0);

  return std::tuple<glm::vec3, glm::vec3, glm::vec3>{lookDir, upDir, rightDir};
}